

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

int Abc_NtkClpOneGia_rec(Gia_Man_t *pNew,Abc_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  int iLit1;
  int iLit0;
  Abc_Obj_t *pNode_local;
  Gia_Man_t *pNew_local;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pNode);
  if (((iVar1 == 0) && (iVar1 = Abc_ObjFaninNum(pNode), iVar1 != 0)) &&
     (iVar1 = Abc_ObjIsCi(pNode), iVar1 == 0)) {
    iVar1 = Abc_ObjIsNode(pNode);
    if (iVar1 != 0) {
      Abc_NodeSetTravIdCurrent(pNode);
      pAVar4 = Abc_ObjFanin0(pNode);
      iVar1 = Abc_NtkClpOneGia_rec(pNew,pAVar4);
      pAVar4 = Abc_ObjFanin1(pNode);
      iVar2 = Abc_NtkClpOneGia_rec(pNew,pAVar4);
      iVar3 = Abc_ObjFaninC0(pNode);
      iVar1 = Abc_LitNotCond(iVar1,iVar3);
      iVar3 = Abc_ObjFaninC1(pNode);
      iVar2 = Abc_LitNotCond(iVar2,iVar3);
      iVar1 = Gia_ManHashAnd(pNew,iVar1,iVar2);
      (pNode->field_6).iTemp = iVar1;
      return iVar1;
    }
    __assert_fail("Abc_ObjIsNode( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcUtil.c"
                  ,0xc80,"int Abc_NtkClpOneGia_rec(Gia_Man_t *, Abc_Obj_t *)");
  }
  return (pNode->field_6).iTemp;
}

Assistant:

int Abc_NtkClpOneGia_rec( Gia_Man_t * pNew, Abc_Obj_t * pNode )
{
    int iLit0, iLit1;
    if ( Abc_NodeIsTravIdCurrent(pNode) || Abc_ObjFaninNum(pNode) == 0 || Abc_ObjIsCi(pNode) )
        return pNode->iTemp;
    assert( Abc_ObjIsNode( pNode ) );
    Abc_NodeSetTravIdCurrent( pNode );
    iLit0 = Abc_NtkClpOneGia_rec( pNew, Abc_ObjFanin0(pNode) );
    iLit1 = Abc_NtkClpOneGia_rec( pNew, Abc_ObjFanin1(pNode) );
    iLit0 = Abc_LitNotCond( iLit0, Abc_ObjFaninC0(pNode) );
    iLit1 = Abc_LitNotCond( iLit1, Abc_ObjFaninC1(pNode) );
    return (pNode->iTemp = Gia_ManHashAnd(pNew, iLit0, iLit1));
}